

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint __thiscall Js::FunctionBody::GetLoopInterpretCount(FunctionBody *this,LoopHeader *loopHeader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  uVar1 = this->loopInterpreterLimit;
  if (loopHeader->isNested != true) {
    return uVar1;
  }
  uVar4 = GetReducedLoopInterpretCount();
  if (uVar1 < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ca4,
                                "(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount())",
                                "GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = GetReducedLoopInterpretCount();
  return uVar4;
}

Assistant:

uint FunctionBody::GetLoopInterpretCount(LoopHeader* loopHeader) const
    {
        if(loopHeader->isNested)
        {
            Assert(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount());
            return GetReducedLoopInterpretCount();
        }
        return GetLoopInterpreterLimit();
    }